

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
CoreML::FeatureType::toDictionary_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FeatureType *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  uint uVar6;
  uint32 uVar7;
  mapped_type *pmVar8;
  DictionaryFeatureType *pDVar9;
  SequenceFeatureType *pSVar10;
  SizeRange *pSVar11;
  ImageFeatureType *params;
  ArrayFeatureType *params_00;
  Type *pTVar12;
  ArrayFeatureType_EnumeratedShapes *pAVar13;
  Type *pTVar14;
  long *plVar15;
  Type *pTVar16;
  ImageFeatureType_EnumeratedImageSizes *pIVar17;
  ImageFeatureType_ImageSizeRange *pIVar18;
  SizeRange *pSVar19;
  char useArrayFormat;
  ulong uVar20;
  TypeCase in_EDX;
  KeyTypeCase extraout_EDX;
  KeyTypeCase extraout_EDX_00;
  KeyTypeCase extraout_EDX_01;
  KeyTypeCase tag;
  KeyTypeCase extraout_EDX_02;
  KeyTypeCase extraout_EDX_03;
  ImageFeatureType_ColorSpace extraout_EDX_04;
  ImageFeatureType_ColorSpace extraout_EDX_05;
  ImageFeatureType_ColorSpace extraout_EDX_06;
  ImageFeatureType_ColorSpace colorspace;
  int d;
  int index;
  char *pcVar21;
  ulong uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  int i;
  int iVar24;
  ulong uVar25;
  _Alloc_hider _Var26;
  undefined1 uVar27;
  uint uVar28;
  char *pcVar29;
  string __str;
  vector<long,_std::allocator<long>_> defaultSize;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> ranges;
  string local_b8;
  key_type local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_70;
  vector<long,_std::allocator<long>_> local_68;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_48;
  
  uVar28 = ((this->m_type).
            super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->_oneof_case_[0];
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70 = __return_storage_ptr__;
  featureTypeToString_abi_cxx11_(&local_b8,(CoreML *)(ulong)uVar28,in_EDX);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"type","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_70,&local_90);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  pcVar29 = "0";
  pcVar21 = "0";
  if (((this->m_type).
       super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      isoptional_ != false) {
    pcVar21 = "1";
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"isOptional","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_70,&local_b8);
  uVar27 = 1;
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar21);
  tag = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    tag = extraout_EDX_00;
  }
  if (3 < uVar28 - 4) {
    return local_70;
  }
  useArrayFormat = (char)(&switchD_002741ee::switchdataD_00345d68)[uVar28 - 4] + 'h';
  switch(uVar28) {
  case 4:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 4) {
      params = (peVar3->Type_).imagetype_;
    }
    else {
      params = Specification::ImageFeatureType::default_instance();
    }
    defaultSizeOf(&local_68,params);
    uVar25 = *local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar22 = -uVar25;
    if (0 < (long)uVar25) {
      uVar22 = uVar25;
    }
    uVar28 = 1;
    if (9 < uVar22) {
      uVar20 = uVar22;
      uVar6 = 4;
      do {
        uVar28 = uVar6;
        if (uVar20 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_00274975;
        }
        if (uVar20 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_00274975;
        }
        if (uVar20 < 10000) goto LAB_00274975;
        bVar5 = 99999 < uVar20;
        uVar20 = uVar20 / 10000;
        uVar6 = uVar28 + 4;
      } while (bVar5);
      uVar28 = uVar28 + 1;
    }
LAB_00274975:
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar28 - (char)((long)uVar25 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_b8._M_dataplus._M_p + -((long)uVar25 >> 0x3f),uVar28,uVar22);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"width","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    uVar25 = local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    uVar22 = -uVar25;
    if (0 < (long)uVar25) {
      uVar22 = uVar25;
    }
    uVar28 = 1;
    if (9 < uVar22) {
      uVar20 = uVar22;
      uVar6 = 4;
      do {
        uVar28 = uVar6;
        if (uVar20 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_00274a83;
        }
        if (uVar20 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_00274a83;
        }
        if (uVar20 < 10000) goto LAB_00274a83;
        bVar5 = 99999 < uVar20;
        uVar20 = uVar20 / 10000;
        uVar6 = uVar28 + 4;
      } while (bVar5);
      uVar28 = uVar28 + 1;
    }
LAB_00274a83:
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar28 - (char)((long)uVar25 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_b8._M_dataplus._M_p + -((long)uVar25 >> 0x3f),uVar28,uVar22);
    paVar2 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"height","");
    paVar4 = &local_b8.field_2;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
    colorspace = extraout_EDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      colorspace = extraout_EDX_05;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar4) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      colorspace = extraout_EDX_06;
    }
    colorSpaceToString_abi_cxx11_(&local_b8,(CoreML *)(ulong)(uint)params->colorspace_,colorspace);
    local_90._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"colorspace","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar4) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pcVar21 = "0";
    if (params->colorspace_ != 0x28) {
      pcVar21 = "1";
    }
    if (params->colorspace_ == 10) {
      pcVar21 = "0";
    }
    local_b8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"isColor","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_b8);
    std::__cxx11::string::_M_replace
              ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar4) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (params->_oneof_case_[0] != 0) {
      pcVar29 = "1";
    }
    local_b8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"hasSizeFlexibility","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_b8);
    std::__cxx11::string::_M_replace
              ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar29);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar4) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (params->_oneof_case_[0] == 0x15) {
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar24 = 0;
      uVar7 = 0x15;
      while( true ) {
        if (uVar7 == 0x15) {
          pIVar17 = (params->SizeFlexibility_).enumeratedsizes_;
        }
        else {
          pIVar17 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
        }
        uVar27 = SUB81(pcVar29,0);
        if ((pIVar17->sizes_).super_RepeatedPtrFieldBase.current_size_ <= iVar24) break;
        local_b8._M_dataplus._M_p = (pointer)0x0;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_allocated_capacity = 0;
        if (params->_oneof_case_[0] == 0x15) {
          pIVar17 = (params->SizeFlexibility_).enumeratedsizes_;
        }
        else {
          pIVar17 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
        }
        pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                            (&(pIVar17->sizes_).super_RepeatedPtrFieldBase,iVar24);
        local_90._M_dataplus._M_p = (pointer)pTVar16->width_;
        if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    ((vector<long,_std::allocator<long>_> *)&local_b8,
                     (iterator)local_b8._M_string_length,(long *)&local_90);
        }
        else {
          *(pointer *)local_b8._M_string_length = local_90._M_dataplus._M_p;
          local_b8._M_string_length = local_b8._M_string_length + 8;
        }
        if (params->_oneof_case_[0] == 0x15) {
          pIVar17 = (params->SizeFlexibility_).enumeratedsizes_;
        }
        else {
          pIVar17 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
        }
        pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                            (&(pIVar17->sizes_).super_RepeatedPtrFieldBase,iVar24);
        local_90._M_dataplus._M_p = (pointer)pTVar16->height_;
        if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    ((vector<long,_std::allocator<long>_> *)&local_b8,
                     (iterator)local_b8._M_string_length,(long *)&local_90);
        }
        else {
          *(pointer *)local_b8._M_string_length = local_90._M_dataplus._M_p;
          local_b8._M_string_length = local_b8._M_string_length + 8;
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::push_back(&local_48,(value_type *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_b8._M_dataplus._M_p,
                          local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
        }
        iVar24 = iVar24 + 1;
        uVar7 = params->_oneof_case_[0];
      }
      enumeratedShapesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_48,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x1,(bool)uVar27);
      paVar2 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"enumeratedSizes","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      enumeratedShapesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_48,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x0,(bool)uVar27);
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sizeFlexibility","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector(&local_48);
    }
    else if (params->_oneof_case_[0] == 0x1f) {
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pSVar11 = ((params->SizeFlexibility_).imagesizerange_)->widthrange_;
      if (pSVar11 == (SizeRange *)0x0) {
        pSVar11 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      local_b8._M_dataplus._M_p = (pointer)pSVar11->lowerbound_;
      local_b8._M_string_length = pSVar11->upperbound_;
      std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
      _M_realloc_insert<std::pair<long,long>>
                ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&local_48,
                 (iterator)0x0,(pair<long,_long> *)&local_b8);
      if (params->_oneof_case_[0] == 0x1f) {
        pIVar18 = (params->SizeFlexibility_).imagesizerange_;
        pSVar11 = pIVar18->heightrange_;
        if (pSVar11 == (SizeRange *)0x0) {
          pSVar11 = (SizeRange *)&Specification::_SizeRange_default_instance_;
        }
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pSVar11->lowerbound_;
      }
      else {
        pIVar18 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
        pSVar11 = (SizeRange *)(ulong)params->_oneof_case_[0];
        pSVar19 = pIVar18->heightrange_;
        if (pSVar19 == (SizeRange *)0x0) {
          pSVar19 = (SizeRange *)&Specification::_SizeRange_default_instance_;
        }
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pSVar19->lowerbound_;
        if (params->_oneof_case_[0] == 0x1f) {
          pIVar18 = (params->SizeFlexibility_).imagesizerange_;
        }
        else {
          pIVar18 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
        }
      }
      uVar27 = SUB81(pSVar11,0);
      pSVar11 = pIVar18->heightrange_;
      if (pSVar11 == (SizeRange *)0x0) {
        pSVar11 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      local_b8._M_string_length = pSVar11->upperbound_;
      local_b8._M_dataplus._M_p = (pointer)paVar23;
      if (local_48.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_48.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        _M_realloc_insert<std::pair<long,long>>
                  ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&local_48,
                   (iterator)
                   local_48.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(pair<long,_long> *)&local_b8);
      }
      else {
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&(local_48.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super__Vector_base<long,_std::allocator<long>_> = paVar23;
        *(size_type *)
         ((long)local_48.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = local_b8._M_string_length;
        local_48.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_48.
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x10);
      }
      dimensionRangesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_48,
                 (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x1,
                 (bool)uVar27);
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sizeRange","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar4) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      dimensionRangesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_48,
                 (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x0,
                 (bool)uVar27);
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sizeFlexibility","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar4) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        uVar25 = (long)local_48.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)local_48.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        _Var26._M_p = (pointer)local_48.
                               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00275049;
      }
    }
    break;
  case 5:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 5) {
      params_00 = (peVar3->Type_).multiarraytype_;
    }
    else {
      params_00 = Specification::ArrayFeatureType::default_instance();
      tag = extraout_EDX_03;
    }
    dataTypeToString_abi_cxx11_(&local_b8,(CoreML *)(ulong)(uint)params_00->datatype_,tag);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"dataType","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    defaultShapeOf(&local_68,params_00);
    dimensionsToString_abi_cxx11_
              (&local_b8,(CoreML *)&local_68,(vector<long,_std::allocator<long>_> *)0x1,
               (bool)useArrayFormat);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"shape","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (params_00->_oneof_case_[0] != 0) {
      pcVar29 = "1";
    }
    local_b8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"hasShapeFlexibility","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_b8);
    std::__cxx11::string::_M_replace
              ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar29);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (params_00->_oneof_case_[0] == 0x15) {
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      iVar24 = 0;
      uVar7 = 0x15;
      while( true ) {
        if (uVar7 == 0x15) {
          pAVar13 = (params_00->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar13 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
        }
        uVar27 = SUB81(pcVar29,0);
        if ((pAVar13->shapes_).super_RepeatedPtrFieldBase.current_size_ <= iVar24) break;
        local_b8._M_dataplus._M_p = (pointer)0x0;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_allocated_capacity = 0;
        index = 0;
        while( true ) {
          if (params_00->_oneof_case_[0] == 0x15) {
            pAVar13 = (params_00->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar13 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
          }
          pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                              (&(pAVar13->shapes_).super_RepeatedPtrFieldBase,iVar24);
          if ((pTVar14->shape_).current_size_ <= index) break;
          if (params_00->_oneof_case_[0] == 0x15) {
            pAVar13 = (params_00->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar13 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
          }
          pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                              (&(pAVar13->shapes_).super_RepeatedPtrFieldBase,iVar24);
          plVar15 = google::protobuf::RepeatedField<long>::Get(&pTVar14->shape_,index);
          local_90._M_dataplus._M_p = (pointer)*plVar15;
          if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      ((vector<long,_std::allocator<long>_> *)&local_b8,
                       (iterator)local_b8._M_string_length,(long *)&local_90);
          }
          else {
            *(pointer *)local_b8._M_string_length = local_90._M_dataplus._M_p;
            local_b8._M_string_length = local_b8._M_string_length + 8;
          }
          index = index + 1;
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)&local_68,(value_type *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_b8._M_dataplus._M_p,
                          local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
        }
        iVar24 = iVar24 + 1;
        uVar7 = params_00->_oneof_case_[0];
      }
      enumeratedShapesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_68,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x1,(bool)uVar27);
      paVar2 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"enumeratedShapes","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      enumeratedShapesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_68,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x0,(bool)uVar27);
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"shapeFlexibility","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)&local_68);
      return local_70;
    }
    if (params_00->_oneof_case_[0] != 0x1f) {
      return local_70;
    }
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar24 = 0;
    uVar7 = 0x1f;
    while( true ) {
      if (uVar7 == 0x1f) {
        pAVar13 = (params_00->ShapeFlexibility_).enumeratedshapes_;
      }
      else {
        pAVar13 = (ArrayFeatureType_EnumeratedShapes *)
                  Specification::ArrayFeatureType_ShapeRange::default_instance();
      }
      uVar27 = SUB81(pcVar29,0);
      if ((((RepeatedPtrField<CoreML::Specification::SizeRange> *)&pAVar13->shapes_)->
          super_RepeatedPtrFieldBase).current_size_ <= iVar24) break;
      if (params_00->_oneof_case_[0] == 0x1f) {
        pAVar13 = (params_00->ShapeFlexibility_).enumeratedshapes_;
      }
      else {
        pAVar13 = (ArrayFeatureType_EnumeratedShapes *)
                  Specification::ArrayFeatureType_ShapeRange::default_instance();
      }
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                          ((RepeatedPtrFieldBase *)&pAVar13->shapes_,iVar24);
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pTVar12->lowerbound_;
      if (params_00->_oneof_case_[0] == 0x1f) {
        pAVar13 = (params_00->ShapeFlexibility_).enumeratedshapes_;
      }
      else {
        pAVar13 = (ArrayFeatureType_EnumeratedShapes *)
                  Specification::ArrayFeatureType_ShapeRange::default_instance();
      }
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                          ((RepeatedPtrFieldBase *)&pAVar13->shapes_,iVar24);
      local_b8._M_string_length = pTVar12->upperbound_;
      local_b8._M_dataplus._M_p = (pointer)paVar4;
      if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        _M_realloc_insert<std::pair<long,long>>
                  ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(pair<long,_long> *)&local_b8);
      }
      else {
        *local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = (long)paVar4;
        *(size_type *)
         ((long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) = local_b8._M_string_length;
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                    .super__Vector_impl_data._M_finish + 0x10);
      }
      iVar24 = iVar24 + 1;
      uVar7 = params_00->_oneof_case_[0];
    }
    dimensionRangesToString_abi_cxx11_
              (&local_b8,(CoreML *)&local_68,
               (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x1,
               (bool)uVar27);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"shapeRange","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    dimensionRangesToString_abi_cxx11_
              (&local_b8,(CoreML *)&local_68,
               (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x0,
               (bool)uVar27);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"shapeFlexibility","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      uVar25 = local_b8.field_2._M_allocated_capacity + 1;
      _Var26._M_p = local_b8._M_dataplus._M_p;
LAB_00275049:
      operator_delete(_Var26._M_p,uVar25);
    }
    break;
  case 6:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 6) {
      pDVar9 = (peVar3->Type_).dictionarytype_;
    }
    else {
      pDVar9 = Specification::DictionaryFeatureType::default_instance();
      tag = extraout_EDX_01;
    }
    keyTypeToString_abi_cxx11_(&local_b8,(CoreML *)(ulong)pDVar9->_oneof_case_[0],tag);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"keyType","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    goto LAB_00274351;
  case 7:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 7) {
      pSVar10 = (peVar3->Type_).sequencetype_;
    }
    else {
      pSVar10 = Specification::SequenceFeatureType::default_instance();
      tag = extraout_EDX_02;
    }
    sequenceTypeToString_abi_cxx11_(&local_b8,(CoreML *)(ulong)pSVar10->_oneof_case_[0],tag);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"valueType","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pSVar11 = pSVar10->sizerange_;
    if (pSVar11 == (SizeRange *)0x0) {
      pSVar11 = (SizeRange *)&Specification::_SizeRange_default_instance_;
    }
    rangeToString_abi_cxx11_
              (&local_b8,(CoreML *)pSVar11->lowerbound_,pSVar11->upperbound_,1,(bool)uVar27);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sizeRange","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
LAB_00274351:
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar2) {
      return local_70;
    }
    uVar25 = local_b8.field_2._M_allocated_capacity + 1;
    _Var26._M_p = local_b8._M_dataplus._M_p;
    goto LAB_00275060;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    uVar25 = (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
    _Var26._M_p = (pointer)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start;
LAB_00275060:
    operator_delete(_Var26._M_p,uVar25);
  }
  return local_70;
}

Assistant:

std::map<std::string,std::string> FeatureType::toDictionary() const {
        Specification::FeatureType::TypeCase tag = m_type->Type_case();

        std::map<std::string, std::string> dict;
        dict["type"] = featureTypeToString(tag);
        dict["isOptional"] = m_type->isoptional() ? "1" : "0";

        switch (tag) {
            case Specification::FeatureType::kMultiArrayType:
            {
                const Specification::ArrayFeatureType& params = m_type->multiarraytype();
                dict["dataType"] = dataTypeToString(params.datatype());
                dict["shape"] = dimensionsToString(defaultShapeOf(params),true);
                dict["hasShapeFlexibility"] = params.ShapeFlexibility_case() != Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET ? "1" : "0";
                switch (params.ShapeFlexibility_case()) {
                    case Specification::ArrayFeatureType::kEnumeratedShapes: {
                        std::vector<std::vector<int64_t>> shapes = enumeratedShapesOf(params);
                        dict["enumeratedShapes"] = enumeratedShapesToString(shapes,true);
                        dict["shapeFlexibility"] = enumeratedShapesToString(shapes,false);
                        break;
                    }
                    case Specification::ArrayFeatureType::kShapeRange: {
                        std::vector<std::pair<int64_t,int64_t>> ranges = shapeRangesOf(params);
                        dict["shapeRange"] = dimensionRangesToString(ranges,true);
                        dict["shapeFlexibility"] = dimensionRangesToString(ranges,false);
                        break;
                    }
                    case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                        break;
                }
                break;
            }
            case Specification::FeatureType::kDictionaryType:
            {
                dict["keyType"] = keyTypeToString(m_type->dictionarytype().KeyType_case());
                break;
            }
            case Specification::FeatureType::kImageType:
            {
                const Specification::ImageFeatureType& params = m_type->imagetype();
                auto defaultSize = defaultSizeOf(params);
                dict["width"] = std::to_string(defaultSize[0]);
                dict["height"] = std::to_string(defaultSize[1]);
                dict["colorspace"] = colorSpaceToString(params.colorspace());
                dict["isColor"] = (params.colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE ||
                                   params.colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16) ? "0" : "1";
                dict["hasSizeFlexibility"] = params.SizeFlexibility_case() != Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET ? "1" : "0";
                switch (params.SizeFlexibility_case()) {
                    case Specification::ImageFeatureType::kEnumeratedSizes: {
                        std::vector<std::vector<int64_t>> shapes = enumeratedSizesOf(params);
                        dict["enumeratedSizes"] = enumeratedShapesToString(shapes,true);
                        dict["sizeFlexibility"] = enumeratedShapesToString(shapes,false);
                        break;
                    }
                    case Specification::ImageFeatureType::kImageSizeRange: {
                        std::vector<std::pair<int64_t,int64_t>> ranges = sizeRangesOf(params);
                        dict["sizeRange"] = dimensionRangesToString(ranges,true);
                        dict["sizeFlexibility"] = dimensionRangesToString(ranges,false);
                        break;
                    }
                    case Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET:
                        break;
                }
                break;
            }
            case Specification::FeatureType::kSequenceType:
            {
                const Specification::SequenceFeatureType& params = m_type->sequencetype();
                dict["valueType"] = sequenceTypeToString(params.Type_case());
                dict["sizeRange"] = rangeToString((int64_t)params.sizerange().lowerbound(), params.sizerange().upperbound(),true);
                break;
            }
            default:
                break;
        }

        return dict;
    }